

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int SetMotorPWMRequestRPLIDAR(RPLIDAR *pRPLIDAR,int pwm)

{
  int iVar1;
  int i;
  long lVar2;
  ssize_t sVar3;
  uchar res;
  uint uVar4;
  ulong uVar5;
  uchar reqbuf [6];
  undefined3 local_28;
  undefined1 uStack_25;
  undefined1 uStack_24;
  byte bStack_23;
  timespec local_20;
  
  _local_28 = CONCAT13((char)pwm,0x2f0a5);
  uStack_24 = (undefined1)((uint)pwm >> 8);
  lVar2 = 0;
  bStack_23 = 0;
  do {
    bStack_23 = bStack_23 ^ *(byte *)((long)&local_28 + lVar2);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  iVar1 = (pRPLIDAR->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pRPLIDAR->RS232Port).s;
    uVar5 = 0;
    do {
      sVar3 = send(iVar1,(void *)((long)&local_28 + uVar5),(long)(6 - (int)uVar5),0);
      if ((int)sVar3 < 1) goto LAB_001aa1ce;
      uVar4 = (int)uVar5 + (int)sVar3;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < 6);
  }
  else {
    if (iVar1 != 0) {
LAB_001aa1ce:
      puts("Error writing data to a RPLIDAR. ");
      return 1;
    }
    iVar1 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar5 = 0;
    do {
      sVar3 = write(iVar1,(void *)((long)&local_28 + uVar5),(ulong)(6 - (int)uVar5));
      if ((int)sVar3 < 1) goto LAB_001aa1ce;
      uVar4 = (int)uVar5 + (int)sVar3;
      uVar5 = (ulong)uVar4;
    } while (uVar4 < 6);
  }
  local_20.tv_sec = 0;
  local_20.tv_nsec = 500000000;
  nanosleep(&local_20,(timespec *)0x0);
  return 0;
}

Assistant:

inline int SetMotorPWMRequestRPLIDAR(RPLIDAR* pRPLIDAR, int pwm)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
	if (IS_FAIL(pRPLIDAR->drv->setMotorPWM((_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorPWM() failed. \n");
		return EXIT_FAILURE;
	}
#else
	if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed((sl_u16)pwm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SET_MOTOR_PWM_REQUEST_RPLIDAR,0x02,0,0,0};

	reqbuf[3] = (unsigned char)pwm;
	reqbuf[4] = (unsigned char)(pwm>>8);
	reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	mSleep(500);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}